

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O0

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_123<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_123<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>_>
         *this)

{
  long *plVar1;
  long in_RDI;
  CATCH2_INTERNAL_TEMPLATE_TEST_123<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>
  obj;
  code *local_f8;
  long local_c8 [25];
  
  anon_unknown.dwarf_70180c::
  CATCH2_INTERNAL_TEMPLATE_TEST_123<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>
  ::CATCH2_INTERNAL_TEMPLATE_TEST_123
            ((CATCH2_INTERNAL_TEMPLATE_TEST_123<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>
              *)0x901216);
  local_f8 = *(code **)(in_RDI + 8);
  plVar1 = (long *)((long)local_c8 + *(long *)(in_RDI + 0x10));
  if (((ulong)local_f8 & 1) != 0) {
    local_f8 = *(code **)(local_f8 + *plVar1 + -1);
  }
  (*local_f8)(plVar1);
  anon_unknown.dwarf_70180c::
  CATCH2_INTERNAL_TEMPLATE_TEST_123<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>
  ::~CATCH2_INTERNAL_TEMPLATE_TEST_123
            ((CATCH2_INTERNAL_TEMPLATE_TEST_123<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>
              *)0x90127a);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }